

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::SADSkipx4Test_SrcAlignedByWidth_Test::TestBody
          (SADSkipx4Test_SrcAlignedByWidth_Test *this)

{
  anon_unknown.dwarf_259311b::SADSkipx4Test_SrcAlignedByWidth_Test::TestBody
            ((SADSkipx4Test_SrcAlignedByWidth_Test *)(this + -8));
  return;
}

Assistant:

TEST_P(SADSkipx4Test, SrcAlignedByWidth) {
  uint8_t *tmp_source_data = source_data_;
  source_data_ += width_;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  source_data_ = tmp_source_data;
}